

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

bool __thiscall
kj::anon_unknown_8::DiskHandle::tryReplaceNode
          (DiskHandle *this,PathPtr path,WriteMode mode,Function<int_(kj::StringPtr)> *tryCreate)

{
  PathPtr finalName;
  DiskHandle *pDVar1;
  bool bVar2;
  WriteMode WVar3;
  int iVar4;
  size_t sVar5;
  Function<int_(kj::StringPtr)> *pFVar6;
  NullableValue<kj::String> *other;
  String *pSVar7;
  PathPtr PVar8;
  Fault local_170;
  Fault f_2;
  undefined1 auStack_160 [4];
  int error_1;
  NullableValue<kj::String> *local_158;
  int local_14c;
  undefined1 auStack_148 [4];
  int _kjSyscallError_1;
  ArrayPtr<const_char> local_138;
  Function<int_(kj::StringPtr)> local_128;
  String *local_118;
  String *pSStack_110;
  Maybe<kj::String> local_100;
  undefined1 local_e0 [8];
  NullableValue<kj::String> tempPath;
  Fault f_1;
  undefined1 auStack_80 [4];
  int error;
  String *local_78;
  int local_6c;
  undefined1 local_68 [4];
  int _kjSyscallError;
  String filename;
  Fault local_40;
  Fault f;
  Function<int_(kj::StringPtr)> *tryCreate_local;
  WriteMode mode_local;
  DiskHandle *this_local;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)path.parts.size_;
  this_local = (DiskHandle *)path.parts.ptr;
  f.exception = (Exception *)tryCreate;
  sVar5 = PathPtr::size((PathPtr *)&this_local);
  if (sVar5 == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x39c,FAILED,(char *)0x0,"\"can\'t replace self\"",
               (char (*) [19])"can\'t replace self");
    path_local.parts.size_._7_1_ = 0;
    kj::_::Debug::Fault::~Fault(&local_40);
    goto LAB_00a11b35;
  }
  PathPtr::toString((String *)local_68,(PathPtr *)&this_local,false);
  bVar2 = has<kj::WriteMode,void>(mode,CREATE);
  if (bVar2) {
    local_78 = (String *)local_68;
    _auStack_80 = tryCreate;
    iVar4 = kj::_::Debug::
            syscallError<kj::(anonymous_namespace)::DiskHandle::tryReplaceNode(kj::PathPtr,kj::WriteMode,kj::Function<int(kj::StringPtr)>)const::_lambda()_1_>
                      ((anon_class_16_2_6d9a4a07 *)auStack_80,false);
    local_6c = iVar4;
    if (iVar4 == 0) {
      path_local.parts.size_._7_1_ = 1;
    }
    else {
      if (iVar4 == 2) {
        bVar2 = has<kj::WriteMode,void>(mode,CREATE_PARENT);
        if ((bVar2) && (sVar5 = PathPtr::size((PathPtr *)&this_local), sVar5 != 0)) {
          PVar8 = PathPtr::parent((PathPtr *)&this_local);
          WVar3 = operator|(CREATE,MODIFY);
          WVar3 = operator|(WVar3,CREATE_PARENT);
          bVar2 = tryMkdir(this,PVar8,WVar3,true);
          pSVar7 = path_local.parts.ptr;
          pDVar1 = this_local;
          if (bVar2) {
            WVar3 = operator-(mode,CREATE_PARENT);
            pFVar6 = mv<kj::Function<int(kj::StringPtr)>>(tryCreate);
            Function<int_(kj::StringPtr)>::Function((Function<int_(kj::StringPtr)> *)&f_1,pFVar6);
            PVar8.parts.size_ = (size_t)pSVar7;
            PVar8.parts.ptr = (String *)pDVar1;
            path_local.parts.size_._7_1_ =
                 tryReplaceNode(this,PVar8,WVar3,(Function<int_(kj::StringPtr)> *)&f_1);
            Function<int_(kj::StringPtr)>::~Function((Function<int_(kj::StringPtr)> *)&f_1);
            goto LAB_00a11b1f;
          }
        }
      }
      else if (iVar4 == 0x11) {
        bVar2 = has<kj::WriteMode,void>(mode,MODIFY);
        if (bVar2) goto LAB_00a11863;
        path_local.parts.size_._7_1_ = 0;
        goto LAB_00a11b1f;
      }
      kj::_::Debug::Fault::Fault<int,kj::PathPtr&>
                ((Fault *)&tempPath.field_1.value.content.disposer,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x3b5,iVar4,"create(path)","path",(PathPtr *)&this_local);
      path_local.parts.size_._7_1_ = 0;
      kj::_::Debug::Fault::~Fault((Fault *)&tempPath.field_1.value.content.disposer);
    }
  }
  else {
LAB_00a11863:
    local_118 = (String *)this_local;
    pSStack_110 = path_local.parts.ptr;
    pFVar6 = mv<kj::Function<int(kj::StringPtr)>>(tryCreate);
    Function<int_(kj::StringPtr)>::Function(&local_128,pFVar6);
    finalName.parts.size_ = (size_t)pSStack_110;
    finalName.parts.ptr = local_118;
    createNamedTemporary(&local_100,this,finalName,mode,&local_128);
    other = kj::_::readMaybe<kj::String>(&local_100);
    kj::_::NullableValue<kj::String>::NullableValue((NullableValue<kj::String> *)local_e0,other);
    Maybe<kj::String>::~Maybe(&local_100);
    Function<int_(kj::StringPtr)>::~Function(&local_128);
    pSVar7 = kj::_::NullableValue::operator_cast_to_String_((NullableValue *)local_e0);
    if (pSVar7 == (String *)0x0) {
      path_local.parts.size_._7_1_ = 0;
    }
    else {
      StringPtr::StringPtr((StringPtr *)&local_138,(String *)local_68);
      iVar4 = AutoCloseFd::operator_cast_to_int(&this->fd);
      pSVar7 = kj::_::NullableValue<kj::String>::operator*((NullableValue<kj::String> *)local_e0);
      StringPtr::StringPtr((StringPtr *)auStack_148,pSVar7);
      bVar2 = tryCommitReplacement
                        (this,(StringPtr)local_138,iVar4,(StringPtr)_auStack_148,mode,(int *)0x0);
      if (bVar2) {
        path_local.parts.size_._7_1_ = 1;
      }
      else {
        local_158 = (NullableValue<kj::String> *)local_e0;
        _auStack_160 = this;
        iVar4 = kj::_::Debug::
                syscallError<kj::(anonymous_namespace)::DiskHandle::tryReplaceNode(kj::PathPtr,kj::WriteMode,kj::Function<int(kj::StringPtr)>)const::_lambda()_2_>
                          ((anon_class_16_2_e4133854 *)auStack_160,false);
        local_14c = iVar4;
        if (iVar4 != 0) {
          if (iVar4 != 2) {
            f_2.exception._4_4_ = iVar4;
            pSVar7 = kj::_::NullableValue<kj::String>::operator*
                               ((NullableValue<kj::String> *)local_e0);
            kj::_::Debug::Fault::Fault<int,kj::String&>
                      (&local_170,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                       ,0x3c8,iVar4,"unlinkat(fd, tempPath, 0)","*tempPath",pSVar7);
            kj::_::Debug::Fault::fatal(&local_170);
          }
          f_2.exception._4_4_ = 2;
        }
        path_local.parts.size_._7_1_ = 0;
      }
    }
    kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)local_e0);
  }
LAB_00a11b1f:
  String::~String((String *)local_68);
LAB_00a11b35:
  return (bool)(path_local.parts.size_._7_1_ & 1);
}

Assistant:

bool tryReplaceNode(PathPtr path, WriteMode mode, Function<int(StringPtr)> tryCreate) const {
    // Replaces the given path with an object created by calling tryCreate().
    //
    // tryCreate() must behave like a syscall which creates the node at the path passed to it,
    // returning a negative value on error. If the path passed to tryCreate already exists, it
    // MUST fail with EEXIST.
    //
    // When `mode` includes MODIFY, replaceNode() reacts to EEXIST by creating the node in a
    // temporary location and then rename()ing it into place.

    if (path.size() == 0) {
      KJ_FAIL_REQUIRE("can't replace self") { return false; }
    }

    auto filename = path.toString();

    if (has(mode, WriteMode::CREATE)) {
      // First try just cerating the node in-place.
      KJ_SYSCALL_HANDLE_ERRORS(tryCreate(filename)) {
        case EEXIST:
          // Target exists.
          if (has(mode, WriteMode::MODIFY)) {
            // Fall back to MODIFY path, below.
            break;
          } else {
            return false;
          }
        case ENOENT:
          if (has(mode, WriteMode::CREATE_PARENT) && path.size() > 0 &&
              tryMkdir(path.parent(), WriteMode::CREATE | WriteMode::MODIFY |
                                      WriteMode::CREATE_PARENT, true)) {
            // Retry, but make sure we don't try to create the parent again.
            return tryReplaceNode(path, mode - WriteMode::CREATE_PARENT, kj::mv(tryCreate));
          }
          // fallthrough
        default:
          KJ_FAIL_SYSCALL("create(path)", error, path) { return false; }
      } else {
        // Success.
        return true;
      }
    }

    // Either we don't have CREATE mode or the target already exists. We need to perform a
    // replacement instead.

    KJ_IF_MAYBE(tempPath, createNamedTemporary(path, mode, kj::mv(tryCreate))) {
      if (tryCommitReplacement(filename, fd, *tempPath, mode)) {
        return true;
      } else {
        KJ_SYSCALL_HANDLE_ERRORS(unlinkat(fd, tempPath->cStr(), 0)) {
          case ENOENT:
            // meh
            break;
          default:
            KJ_FAIL_SYSCALL("unlinkat(fd, tempPath, 0)", error, *tempPath);
        }
        return false;
      }
    } else {
      // threw, but exceptions are disabled
      return false;
    }
  }